

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

void __thiscall QTextBrowser::backward(QTextBrowser *this)

{
  long lVar1;
  QTextBrowserPrivate *this_00;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QTextBrowserPrivate *d;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QTextBrowserPrivate *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextBrowser *)0x6decd0);
  qVar2 = QList<QTextBrowserPrivate::HistoryEntry>::size
                    (&(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>);
  if (1 < qVar2) {
    this_01 = (QTextBrowserPrivate *)&this_00->forwardStack;
    QTextBrowserPrivate::createHistoryEntry(this_00);
    QStack<QTextBrowserPrivate::HistoryEntry>::push
              ((QStack<QTextBrowserPrivate::HistoryEntry> *)this_01,
               (HistoryEntry *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    QTextBrowserPrivate::HistoryEntry::~HistoryEntry((HistoryEntry *)this_01);
    QStack<QTextBrowserPrivate::HistoryEntry>::pop
              ((QStack<QTextBrowserPrivate::HistoryEntry> *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    QTextBrowserPrivate::HistoryEntry::~HistoryEntry((HistoryEntry *)this_01);
    QStack<QTextBrowserPrivate::HistoryEntry>::top
              ((QStack<QTextBrowserPrivate::HistoryEntry> *)0x6ded64);
    QTextBrowserPrivate::restoreHistoryEntry
              (this_01,(HistoryEntry *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)
              );
    QList<QTextBrowserPrivate::HistoryEntry>::size
              (&(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>);
    backwardAvailable((QTextBrowser *)0x6ded99,(bool)in_stack_ffffffffffffff5f);
    forwardAvailable((QTextBrowser *)0x6deda8,(bool)in_stack_ffffffffffffff5f);
    historyChanged((QTextBrowser *)0x6dedb2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextBrowser::backward()
{
    Q_D(QTextBrowser);
    if (d->stack.size() <= 1)
        return;

    // Update the history entry
    d->forwardStack.push(d->createHistoryEntry());
    d->stack.pop(); // throw away the old version of the current entry
    d->restoreHistoryEntry(d->stack.top()); // previous entry
    emit backwardAvailable(d->stack.size() > 1);
    emit forwardAvailable(true);
    emit historyChanged();
}